

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> * __thiscall
tcb::unicode::
to_utf_string<char32_t,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,wchar_t>
          (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
           *__return_storage_ptr__,unicode *this,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          first,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                last)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(__return_storage_ptr__,(long)first._M_current - (long)this >> 2);
  utf_convert<char32_t,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,std::back_insert_iterator<std::__cxx11::u32string>,wchar_t>
            ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              )this,first,
             (back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<OutCharT>
to_utf_string(InputIt first, Sentinel last)
{
    using string_type = std::basic_string<OutCharT>;

    string_type output;

    // Try to minimise the number of reallocations
    if /*constexpr*/ (std::is_same<typename std::iterator_traits<InputIt>::iterator_category,
                                   std::random_access_iterator_tag>::value) {
        output.reserve(static_cast<typename string_type::size_type>(std::distance(first, last)));
    }

    utf_convert<OutCharT>(first, last, std::back_inserter(output));

    return output;
}